

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameTitle.cpp
# Opt level: O2

void __thiscall GameTitle::GameTitle(GameTitle *this)

{
  Animation::Animation(&this->super_Animation);
  (this->super_Animation)._vptr_Animation = (_func_int **)&PTR_displayAnimation_00133430;
  (this->firstWord).text._M_dataplus._M_p = (pointer)&(this->firstWord).text.field_2;
  (this->firstWord).text._M_string_length = 0;
  (this->firstWord).text.field_2._M_local_buf[0] = '\0';
  (this->secondWord).text._M_dataplus._M_p = (pointer)&(this->secondWord).text.field_2;
  (this->secondWord).text._M_string_length = 0;
  (this->secondWord).text.field_2._M_local_buf[0] = '\0';
  (this->thirdWord).text._M_dataplus._M_p = (pointer)&(this->thirdWord).text.field_2;
  (this->thirdWord).text._M_string_length = 0;
  (this->thirdWord).text.field_2._M_local_buf[0] = '\0';
  (this->fourthWord).text._M_dataplus._M_p = (pointer)&(this->fourthWord).text.field_2;
  (this->fourthWord).text._M_string_length = 0;
  (this->fourthWord).text.field_2._M_local_buf[0] = '\0';
  (this->title)._M_dataplus._M_p = (pointer)&(this->title).field_2;
  (this->title)._M_string_length = 0;
  (this->title).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&(this->super_Animation).name);
  std::__cxx11::string::assign((char *)&(this->super_Animation).description);
  std::__cxx11::string::assign((char *)&this->firstWord);
  std::__cxx11::string::assign((char *)&this->secondWord);
  std::__cxx11::string::assign((char *)&this->thirdWord);
  std::__cxx11::string::assign((char *)&this->fourthWord);
  std::__cxx11::string::assign((char *)&this->title);
  return;
}

Assistant:

GameTitle::GameTitle() {
    // Set the default values of the base class members
    name = "GameTitle";
    description = "A slide-in text animation of the game title. \nIntended for the beginning of the game.";

    // Initialize the private members
    firstWord.text = "Private ";
    secondWord.text = "Keys, ";
    thirdWord.text = "Members ";
    fourthWord.text = "Only";

    title = "Private Keys, Members Only";
}